

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

float nk_layout_row_calculate_usable_space
                (nk_style *style,nk_panel_type type,float total_space,int columns)

{
  nk_vec2 nVar1;
  nk_vec2 nVar2;
  int local_44;
  float local_38;
  nk_vec2 padding;
  nk_vec2 spacing;
  float panel_space;
  float panel_spacing;
  float panel_padding;
  int columns_local;
  float total_space_local;
  nk_panel_type type_local;
  nk_style *style_local;
  
  nVar1 = (style->window).spacing;
  nVar2 = nk_panel_get_padding(style,type);
  local_38 = nVar2.x;
  if (columns + -1 < 0) {
    local_44 = 0;
  }
  else {
    local_44 = columns + -1;
  }
  padding.x = nVar1.x;
  return (total_space - local_38 * 2.0) - (float)local_44 * padding.x;
}

Assistant:

NK_LIB float
nk_layout_row_calculate_usable_space(const struct nk_style *style, enum nk_panel_type type,
    float total_space, int columns)
{
    float panel_padding;
    float panel_spacing;
    float panel_space;

    struct nk_vec2 spacing;
    struct nk_vec2 padding;

    spacing = style->window.spacing;
    padding = nk_panel_get_padding(style, type);

    /* calculate the usable panel space */
    panel_padding = 2 * padding.x;
    panel_spacing = (float)NK_MAX(columns - 1, 0) * spacing.x;
    panel_space  = total_space - panel_padding - panel_spacing;
    return panel_space;
}